

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_uuid_link(intptr_t uuid,void *obj,_func_void_void_ptr *on_close)

{
  char *pcVar1;
  fio_uuid_links_s *set;
  long *plVar2;
  undefined1 *puVar3;
  char cVar4;
  undefined1 uVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  fio_data_s *pfVar9;
  fio_data_s *pfVar10;
  ulong uVar11;
  int *piVar12;
  long lVar13;
  ulong *puVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong *puVar20;
  ulong *puVar21;
  bool bVar22;
  fio_lock_i ret;
  timespec local_48;
  long local_38;
  
  pfVar10 = fio_data;
  if ((uuid < 0) || (uVar17 = (uint)((ulong)uuid >> 8), fio_data->capa <= uVar17)) {
LAB_0012a0f9:
    piVar12 = __errno_location();
    *piVar12 = 9;
    (*on_close)(obj);
    return;
  }
  lVar13 = (long)(int)uVar17 * 0xa8;
  if (*(char *)((long)fio_data + lVar13 + 0x6d) != (char)uuid) goto LAB_0012a0f9;
  LOCK();
  pcVar1 = (char *)((long)fio_data + lVar13 + 0x6e);
  cVar4 = *pcVar1;
  *pcVar1 = '\x01';
  UNLOCK();
  lVar8 = lVar13;
  local_48.tv_sec._0_1_ = cVar4;
  pfVar9 = fio_data;
  while (fio_data = pfVar9, local_38 = lVar8, (char)local_48.tv_sec != '\0') {
    local_48.tv_sec = 0;
    local_48.tv_nsec = 1;
    nanosleep(&local_48,(timespec *)0x0);
    LOCK();
    pcVar1 = (char *)((long)pfVar10 + lVar13 + 0x6e);
    cVar4 = *pcVar1;
    *pcVar1 = '\x01';
    UNLOCK();
    lVar8 = local_38;
    local_48.tv_sec._0_1_ = cVar4;
    pfVar9 = fio_data;
  }
  if ((pfVar9->capa <= uVar17) ||
     (*(char *)((long)&pfVar9[1].thread_ids.obj + lVar8 + 5) != (char)uuid)) {
    LOCK();
    puVar3 = (undefined1 *)((long)&pfVar9[1].thread_ids.obj + lVar8 + 6);
    uVar5 = *puVar3;
    *puVar3 = 0;
    UNLOCK();
    local_48.tv_sec = CONCAT71(local_48.tv_sec._1_7_,uVar5);
    goto LAB_0012a0f9;
  }
  set = (fio_uuid_links_s *)((long)&pfVar9[2].max_protocol_fd + lVar8);
  uVar18 = *(ulong *)((long)&pfVar9[2].max_protocol_fd + lVar8);
  uVar15 = *(ulong *)((long)&pfVar9[3].last_cycle.tv_nsec + lVar8);
  if (uVar18 >> 1 < uVar15 - uVar18) {
LAB_0012a004:
    fio_uuid_links_rehash(set);
  }
  else if (*(ulong *)((long)&pfVar9[3].last_cycle.tv_sec + lVar8) <= uVar15) {
    pcVar1 = (char *)((long)&pfVar9[3].thread_ids.next + lVar8 + 1);
    *pcVar1 = *pcVar1 + '\x01';
    goto LAB_0012a004;
  }
  uVar18 = -(ulong)(obj == (void *)0x0) | (ulong)obj;
  if (*(long *)((long)&pfVar9[3].thread_ids.prev + lVar8) != 0) {
    if ((*(char *)((long)&pfVar9[3].thread_ids.next + lVar8) != '\0') &&
       (*(long *)((long)&pfVar9[3].last_cycle.tv_nsec + lVar8) !=
        *(long *)((long)&pfVar9[2].max_protocol_fd + lVar8))) {
      fio_uuid_links_rehash(set);
    }
    bVar6 = *(byte *)((long)&pfVar9[3].thread_ids.next + lVar8 + 1);
    bVar22 = false;
    uVar15 = 0;
    if (bVar6 != 0) {
      uVar15 = uVar18;
    }
    uVar11 = ~(-1L << (bVar6 & 0x3f));
    uVar15 = uVar15 ^ (uVar18 >> (bVar6 & 0x3f) | uVar18 << 0x40 - (bVar6 & 0x3f));
    lVar13 = *(long *)((long)&pfVar9[3].thread_ids.prev + lVar8);
    lVar19 = (uVar15 & uVar11) * 0x10;
    uVar7 = *(ulong *)(lVar13 + lVar19);
    if (uVar7 == uVar18 || uVar7 == 0) {
      puVar14 = (ulong *)(lVar13 + lVar19);
    }
    else {
      uVar7 = *(ulong *)((long)&pfVar9[3].last_cycle.tv_sec + lVar8);
      puVar14 = (ulong *)((uVar7 >> 2) * 0xb);
      puVar20 = (ulong *)0x420;
      if (uVar7 < 0x181) {
        puVar20 = puVar14;
      }
      puVar21 = (ulong *)0x0;
      while (bVar22 = puVar20 <= puVar21, !bVar22) {
        lVar19 = (uVar15 + 0xb + (long)puVar21 & uVar11) * 0x10;
        puVar14 = (ulong *)(lVar13 + lVar19);
        uVar7 = *(ulong *)(lVar13 + lVar19);
        bVar22 = false;
        if ((uVar7 == 0) || (puVar21 = (ulong *)((long)puVar21 + 0xb), uVar7 == uVar18)) break;
      }
    }
    if (!bVar22) goto LAB_0012a0a5;
  }
  puVar14 = (ulong *)0x0;
LAB_0012a0a5:
  if (puVar14 == (ulong *)0x0) {
    lVar13 = *(long *)((long)&pfVar9[3].last_cycle.tv_nsec + lVar8);
    lVar19 = *(long *)((long)&pfVar9[3].capa + lVar8);
    lVar16 = lVar13 * 0x10;
    *(_func_void_void_ptr **)(lVar19 + 8 + lVar16) = on_close;
    *(ulong *)(lVar19 + lVar16) = uVar18;
    *(long *)((long)&pfVar9[3].last_cycle.tv_nsec + lVar8) = lVar13 + 1;
    plVar2 = (long *)((long)&pfVar9[2].max_protocol_fd + lVar8);
    *plVar2 = *plVar2 + 1;
    fio_uuid_links_rehash(set);
  }
  else {
    if (puVar14[1] == 0) {
      lVar13 = *(long *)((long)&pfVar9[3].last_cycle.tv_nsec + lVar8);
      puVar14[1] = lVar13 * 0x10 + *(long *)((long)&pfVar9[3].capa + lVar8);
      *(long *)((long)&pfVar9[3].last_cycle.tv_nsec + lVar8) = lVar13 + 1;
      plVar2 = (long *)((long)&pfVar9[2].max_protocol_fd + lVar8);
      *plVar2 = *plVar2 + 1;
    }
    *puVar14 = uVar18;
    puVar14 = (ulong *)puVar14[1];
    *puVar14 = uVar18;
    puVar14[1] = (ulong)on_close;
  }
  LOCK();
  *(undefined1 *)((long)&fio_data[1].thread_ids.obj + lVar8 + 6) = 0;
  UNLOCK();
  return;
}

Assistant:

void fio_uuid_link(intptr_t uuid, void *obj, void (*on_close)(void *obj)) {
  if (!uuid_is_valid(uuid))
    goto invalid;
  fio_lock(&uuid_data(uuid).sock_lock);
  if (!uuid_is_valid(uuid))
    goto locked_invalid;
  fio_uuid_links_overwrite(&uuid_data(uuid).links, (uintptr_t)obj, on_close,
                           NULL);
  fio_unlock(&uuid_data(uuid).sock_lock);
  return;
locked_invalid:
  fio_unlock(&uuid_data(uuid).sock_lock);
invalid:
  errno = EBADF;
  on_close(obj);
}